

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

void __thiscall
QtMWidgets::PageControlPrivate::updateButtonsInfo(PageControlPrivate *this,int width)

{
  int iVar1;
  int iVar2;
  QRect QVar3;
  
  if (width < 1) {
    QVar3 = QWidget::rect(&this->q->super_QWidget);
    width = (QVar3.x2 - QVar3.x1) + 1;
  }
  this->widgetWidth = width;
  iVar1 = width / this->buttonSize;
  this->countInOneLine = iVar1;
  if (1 < iVar1) {
    iVar2 = this->count % iVar1;
    this->countInLastLine = iVar2;
    this->linesCount = (uint)(0 < iVar2) + this->count / iVar1;
    if (iVar2 == 0) {
      this->countInLastLine = iVar1;
    }
  }
  return;
}

Assistant:

void
PageControlPrivate::updateButtonsInfo( int width )
{
	if( width <= 0 )
		widgetWidth = q->rect().width();
	else
		widgetWidth = width;

	countInOneLine = widgetWidth / buttonSize;

	if( countInOneLine > 1 )
	{
		countInLastLine = count % countInOneLine;

		linesCount = count / countInOneLine + ( countInLastLine > 0 ? 1 : 0 );

		if( countInLastLine == 0 )
			countInLastLine = countInOneLine;
	}
}